

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O0

z_word_t crc_word_big(z_word_t data)

{
  int local_14;
  z_word_t zStack_10;
  int k;
  z_word_t data_local;
  
  zStack_10 = data;
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    zStack_10 = zStack_10 << 8 ^ crc_big_table[zStack_10 >> 0x38];
  }
  return zStack_10;
}

Assistant:

local z_word_t crc_word_big(data)
    z_word_t data;
{
    int k;
    for (k = 0; k < W; k++)
        data = (data << 8) ^
            crc_big_table[(data >> ((W - 1) << 3)) & 0xff];
    return data;
}